

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void av1_enc_build_inter_predictor
               (AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,BUFFER_SET *ctx,
               BLOCK_SIZE bsize,int plane_from,int plane_to)

{
  MB_MODE_INFO **ppMVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  BLOCK_SIZE BVar5;
  byte bVar6;
  MV_REFERENCE_FRAME ref_frame;
  int iVar7;
  MB_MODE_INFO *pMVar8;
  uint8_t *puVar9;
  WarpedMotionParams *pWVar10;
  MB_MODE_INFO *pMVar11;
  int iVar12;
  MB_MODE_INFO **ppMVar13;
  scale_factors *psVar14;
  char cVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  byte bVar22;
  bool bVar23;
  int col;
  buf_2d *ref_buf;
  long lVar24;
  int ref;
  long lVar25;
  bool bVar26;
  bool bVar27;
  WarpTypesAllowed warp_types;
  MV mv;
  BUFFER_SET *local_170;
  long local_168;
  int is_global [2];
  BUFFER_SET default_ctx;
  int local_b4;
  int local_b0;
  int local_ac [23];
  uint8_t *local_50;
  undefined8 uStack_48;
  BLOCK_SIZE local_40;
  
  lVar19 = (long)plane_from;
  local_168 = lVar19 * 0xa30;
  local_170 = ctx;
  do {
    if ((plane_to < lVar19) || ((lVar19 != 0 && (xd->is_chroma_ref != true)))) {
      return;
    }
    pMVar8 = *xd->mi;
    bVar2 = xd->plane[lVar19].width;
    bVar3 = xd->plane[lVar19].height;
    uVar21 = (ulong)pMVar8->bsize;
    cVar15 = (char)*(undefined2 *)&pMVar8->field_0xa7;
    if (cVar15 < '\0') {
LAB_00204dea:
      cVar4 = pMVar8->ref_frame[1];
      puVar9 = xd->plane[lVar19].dst.buf;
      is_global[0] = 0;
      is_global[1] = 0;
      pWVar10 = xd->global_motion;
      lVar17 = (ulong)('\0' < cVar4) + 1;
      for (lVar24 = 0; lVar17 != lVar24; lVar24 = lVar24 + 1) {
        iVar12 = is_global_mv_block(pMVar8,pWVar10[pMVar8->ref_frame[lVar24]].wmtype);
        is_global[lVar24] = iVar12;
      }
      iVar12 = xd->plane[lVar19].subsampling_x;
      iVar7 = xd->plane[lVar19].subsampling_y;
      lVar24 = local_168;
      for (lVar25 = 0; lVar17 != lVar25; lVar25 = lVar25 + 1) {
        psVar14 = &cm->sf_identity;
        if (-1 < cVar15) {
          psVar14 = xd->block_ref_scale_factors[lVar25];
        }
        ref_buf = (buf_2d *)((long)&xd->plane[0].pre[0].buf + lVar24);
        if (cVar15 < '\0') {
          ref_buf = &xd->plane[lVar19].dst;
        }
        mv = *(MV *)(pMVar8->mv + lVar25);
        warp_types.global_warp_allowed = is_global[lVar25];
        warp_types.local_warp_allowed = (int)(pMVar8->motion_mode == '\x02');
        av1_init_inter_params
                  ((InterPredParams *)&default_ctx,(uint)bVar2,(uint)bVar3,
                   (int)((mi_row - (uint)(iVar7 != 0 && (0x20005UL >> (uVar21 & 0x3f) & 1) != 0)) *
                        4) >> ((byte)iVar7 & 0x1f),
                   (int)((mi_col - (uint)(iVar12 != 0 && (0x10003UL >> (uVar21 & 0x3f) & 1) != 0)) *
                        4) >> ((byte)iVar12 & 0x1f),xd->plane[lVar19].subsampling_x,
                   xd->plane[lVar19].subsampling_y,xd->bd,(uint)xd->cur_buf->flags >> 3 & 1,
                   *(ushort *)&pMVar8->field_0xa7 >> 7 & 1,psVar14,ref_buf,pMVar8->interp_filters);
        if ('\0' < cVar4) {
          default_ctx.plane[0] = (uint8_t *)CONCAT44(1,default_ctx.plane[0]._0_4_);
        }
        local_b4 = 0;
        av1_dist_wtd_comp_weight_assign(cm,pMVar8,&local_b0,local_ac,&local_b4,(uint)('\0' < cVar4))
        ;
        av1_init_warp_params((InterPredParams *)&default_ctx,&warp_types,(int)lVar25,xd,pMVar8);
        if (((pMVar8->interinter_comp).type & 0xfe) == 2) {
          local_40 = pMVar8->bsize;
          uStack_48._0_1_ = (pMVar8->interinter_comp).wedge_index;
          uStack_48._1_1_ = (pMVar8->interinter_comp).wedge_sign;
          uStack_48._2_1_ = (pMVar8->interinter_comp).mask_type;
          uStack_48._3_1_ = (pMVar8->interinter_comp).type;
          uStack_48._4_4_ = *(undefined4 *)&(pMVar8->interinter_comp).field_0xc;
          if (lVar25 == 1) {
            default_ctx.plane[0] = (uint8_t *)CONCAT44(2,default_ctx.plane[0]._0_4_);
          }
          local_50 = xd->seg_mask;
        }
        build_one_inter_predictor
                  (puVar9,xd->plane[lVar19].dst.stride,&mv,(InterPredParams *)&default_ctx);
        lVar24 = lVar24 + 0x20;
      }
    }
    else {
      iVar12 = xd->plane[lVar19].subsampling_x;
      iVar7 = xd->plane[lVar19].subsampling_y;
      bVar20 = (byte)(0x10003L >> (pMVar8->bsize & 0x3f));
      bVar22 = iVar12 != 0 & bVar20;
      bVar26 = (0x20005UL >> (uVar21 & 0x3f) & 1) != 0;
      bVar23 = iVar7 != 0 && bVar26;
      if ((bVar22 == 0) && (iVar7 == 0 || !bVar26)) goto LAB_00204dea;
      lVar17 = -(ulong)bVar23;
      ppMVar13 = (MB_MODE_INFO **)((long)xd->mi + (long)xd->mi_stride * 8 * lVar17);
      for (; lVar24 = -(ulong)bVar22, lVar17 != 1; lVar17 = lVar17 + 1) {
        while (lVar24 != 1) {
          ppMVar1 = ppMVar13 + lVar24;
          if ((((*ppMVar1)->field_0xa7 & 0x80) != 0) ||
             (lVar24 = lVar24 + 1, (*ppMVar1)->ref_frame[0] < '\x01')) goto LAB_00204dea;
        }
        ppMVar13 = ppMVar13 + xd->mi_stride;
      }
      bVar26 = iVar7 != 0;
      bVar27 = iVar12 != 0;
      bVar2 = block_size_wide[uVar21];
      bVar3 = block_size_high[uVar21];
      BVar5 = av1_ss_size_lookup[uVar21][bVar27][bVar26];
      bVar22 = block_size_wide[BVar5];
      bVar20 = bVar20 & bVar27;
      bVar6 = block_size_high[BVar5];
      uVar18 = (uint)bVar23;
      iVar12 = -uVar18;
      for (uVar16 = 0; uVar16 < bVar6; uVar16 = uVar16 + (bVar3 >> bVar26)) {
        lVar17 = -(ulong)bVar20;
        for (uVar21 = 0; uVar21 < bVar22; uVar21 = uVar21 + (bVar2 >> bVar27)) {
          pMVar11 = xd->mi[(long)iVar12 * (long)xd->mi_stride + lVar17];
          iVar7 = xd->plane[lVar19].dst.stride;
          puVar9 = xd->plane[lVar19].dst.buf;
          ref_frame = pMVar11->ref_frame[0];
          get_ref_frame_buf(cm,ref_frame);
          psVar14 = get_ref_scale_factors_const(cm,ref_frame);
          is_global[0] = 0;
          is_global[1] = 0;
          warp_types.global_warp_allowed = pMVar11->mv[0].as_int;
          av1_init_inter_params
                    ((InterPredParams *)&default_ctx,(uint)(bVar2 >> bVar27),(uint)(bVar3 >> bVar26)
                     ,((int)((mi_row - uVar18) * 4) >> bVar26) + uVar16,
                     ((int)((mi_col - (uint)bVar20) * 4) >> bVar27) + (int)uVar21,
                     xd->plane[lVar19].subsampling_x,xd->plane[lVar19].subsampling_y,xd->bd,
                     (uint)xd->cur_buf->flags >> 3 & 1,*(ushort *)&pMVar8->field_0xa7 >> 7 & 1,
                     psVar14,(buf_2d *)is_global,pMVar11->interp_filters);
          local_b4 = 0;
          build_one_inter_predictor
                    (puVar9 + uVar21 + (long)(int)(iVar7 * uVar16),xd->plane[lVar19].dst.stride,
                     (MV *)&warp_types,(InterPredParams *)&default_ctx);
          lVar17 = lVar17 + 1;
        }
        iVar12 = iVar12 + 1;
      }
    }
    pMVar8 = *xd->mi;
    if (((('\0' < pMVar8->ref_frame[0]) && (pMVar8->ref_frame[1] == '\0')) &&
        (0xf8 < (byte)(pMVar8->bsize - BLOCK_32X64))) && (0xfb < (byte)(pMVar8->mode - 0x11))) {
      default_ctx.plane[0] = xd->plane[0].dst.buf;
      default_ctx.plane[1] = xd->plane[1].dst.buf;
      default_ctx.plane[2] = xd->plane[2].dst.buf;
      default_ctx.stride[0] = xd->plane[0].dst.stride;
      default_ctx.stride[1] = xd->plane[1].dst.stride;
      default_ctx.stride[2] = xd->plane[2].dst.stride;
      if (local_170 == (BUFFER_SET *)0x0) {
        local_170 = &default_ctx;
      }
      av1_build_interintra_predictor
                (cm,xd,xd->plane[lVar19].dst.buf,xd->plane[lVar19].dst.stride,local_170,(int)lVar19,
                 bsize);
    }
    lVar19 = lVar19 + 1;
    local_168 = local_168 + 0xa30;
  } while( true );
}

Assistant:

void av1_enc_build_inter_predictor(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                   int mi_row, int mi_col,
                                   const BUFFER_SET *ctx, BLOCK_SIZE bsize,
                                   int plane_from, int plane_to) {
  for (int plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const int mi_x = mi_col * MI_SIZE;
    const int mi_y = mi_row * MI_SIZE;
    enc_build_inter_predictors(cm, xd, plane, xd->mi[0], xd->plane[plane].width,
                               xd->plane[plane].height, mi_x, mi_y);

    if (is_interintra_pred(xd->mi[0])) {
      BUFFER_SET default_ctx = {
        { xd->plane[0].dst.buf, xd->plane[1].dst.buf, xd->plane[2].dst.buf },
        { xd->plane[0].dst.stride, xd->plane[1].dst.stride,
          xd->plane[2].dst.stride }
      };
      if (!ctx) {
        ctx = &default_ctx;
      }
      av1_build_interintra_predictor(cm, xd, xd->plane[plane].dst.buf,
                                     xd->plane[plane].dst.stride, ctx, plane,
                                     bsize);
    }
  }
}